

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O2

void a__GlGetAndPrintInteger(GLenum pname,char *name,int count)

{
  undefined4 in_register_0000003c;
  GLint params [2];
  ulong local_20;
  
  local_20 = 0;
  glGetIntegerv(CONCAT44(in_register_0000003c,pname),&local_20);
  if (count == 1) {
    aAppDebugPrintf("[agl] %s: %d",name,local_20 & 0xffffffff);
  }
  else {
    aAppDebugPrintf("[agl] %s: %d, %d",name,local_20 & 0xffffffff,local_20 >> 0x20);
  }
  return;
}

Assistant:

static void a__GlGetAndPrintInteger(GLenum pname, const char *name, int count) {
	GLint params[2] = {0};
	glGetIntegerv(pname, params);
	if (count == 1)
		AGL_PRINTFLN("%s: %d", name, params[0]);
	else if (count == 2)
		AGL_PRINTFLN("%s: %d, %d", name, params[0], params[1]);
}